

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  Arena **__mutex;
  Logger *info_log;
  undefined1 auVar1 [16];
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  Iterator *iter;
  undefined4 extraout_var_00;
  Version *in_R8;
  long lVar5;
  Slice min_user_key;
  Slice max_user_key;
  FileMetaData meta;
  string local_d0;
  Version *local_b0;
  Version *local_a8;
  long local_a0;
  Slice local_98;
  FileMetaData local_88;
  
  local_b0 = base;
  local_a8 = in_R8;
  iVar4 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_a0 = CONCAT44(extraout_var,iVar4);
  local_88.smallest.rep_._M_dataplus._M_p = (pointer)&local_88.smallest.rep_.field_2;
  local_88.refs = 0;
  local_88.allowed_seeks = 0x40000000;
  local_88.file_size = 0;
  local_88.smallest.rep_._M_string_length = 0;
  local_88.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_88.largest.rep_._M_dataplus._M_p = (pointer)&local_88.largest.rep_.field_2;
  local_88.largest.rep_._M_string_length = 0;
  local_88.largest.rep_.field_2._M_local_buf[0] = '\0';
  lVar5 = *(long *)&mem[4].table_.max_height_;
  local_88.number = *(uint64_t *)(lVar5 + 0x48);
  *(uint64_t *)(lVar5 + 0x48) = local_88.number + 1;
  this_00 = &mem[4].arena_.blocks_;
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)this_00,&local_88.number);
  iter = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",local_88.number);
  __mutex = &mem[1].table_.arena_;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  BuildTable((leveldb *)&local_d0,(string *)&mem[1].arena_.blocks_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (TableCache *)mem[1].table_.compare_.comparator.super_Comparator._vptr_Comparator,iter,
             &local_88);
  (this->super_DB)._vptr_DB = (_func_int **)local_d0._M_dataplus._M_p;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d0._M_string_length;
  local_d0._0_16_ = auVar1 << 0x40;
  Status::~Status((Status *)&local_d0);
  std::mutex::lock((mutex *)__mutex);
  uVar3 = local_88.file_size;
  uVar2 = local_88.number;
  info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
  Status::ToString_abi_cxx11_(&local_d0,(Status *)this);
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar2,uVar3,local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (iter != (Iterator *)0x0) {
    (*iter->_vptr_Iterator[1])(iter);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
           *)this_00,&local_88.number);
  lVar5 = 0;
  if (((this->super_DB)._vptr_DB == (_func_int **)0x0) && (local_88.file_size != 0)) {
    local_d0._0_16_ = InternalKey::user_key(&local_88.smallest);
    local_98 = InternalKey::user_key(&local_88.largest);
    if (local_a8 == (Version *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = Version::PickLevelForMemTableOutput(local_a8,(Slice *)&local_d0,&local_98);
    }
    VersionEdit::AddFile
              ((VersionEdit *)local_b0,iVar4,local_88.number,local_88.file_size,&local_88.smallest,
               &local_88.largest);
    lVar5 = (long)iVar4;
  }
  local_d0._M_string_length = 0;
  iVar4 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_d0._M_dataplus._M_p = (pointer)(CONCAT44(extraout_var_00,iVar4) - local_a0);
  local_d0.field_2._M_allocated_capacity = local_88.file_size;
  CompactionStats::Add
            ((CompactionStats *)((long)&mem[5].comparator_ + lVar5 * 0x18 + 8),
             (CompactionStats *)&local_d0);
  FileMetaData::~FileMetaData(&local_88);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}